

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  sunrealtype y05;
  sunrealtype y04;
  sunrealtype y03;
  sunrealtype y02;
  sunrealtype y01;
  SUNContext ctx;
  SUNLinearSolver LSB;
  SUNLinearSolver LS;
  SUNMatrix AB;
  SUNMatrix A;
  int indexB;
  long nstB;
  long nst;
  sunrealtype time;
  int retval;
  int ncheck;
  N_Vector ypB;
  N_Vector yB;
  N_Vector q;
  N_Vector rr;
  N_Vector yp;
  N_Vector yy;
  void *mem;
  UserData data;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  char *funcname;
  void *returnvalue;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  undefined4 local_50;
  undefined1 local_4c [4];
  long *local_48;
  undefined8 local_40;
  long *local_38;
  undefined8 local_30;
  undefined8 local_28;
  long *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  returnvalue = (void *)0x3f7cac083126e979;
  funcname = (char *)0x0;
  local_18 = 0;
  local_28 = 0;
  local_20 = (long *)0x0;
  local_80 = 0;
  local_78 = 0;
  local_90 = 0;
  local_88 = 0;
  printf("\nAdjoint Sensitivity Example for Akzo-Nobel Chemical Kinetics\n");
  printf("-------------------------------------------------------------\n");
  printf("Sensitivity of G = int_t0^tf (y1) dt with respect to IC.\n");
  printf("-------------------------------------------------------------\n\n");
  local_50 = SUNContext_Create(0,&local_98);
  iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
  if (iVar1 == 0) {
    local_10 = (undefined8 *)malloc(0x48);
    *local_10 = 0x4032b33333333333;
    local_10[1] = 0x3fe28f5c28f5c28f;
    local_10[2] = 0x3fb70a3d70a3d70a;
    local_10[3] = 0x3fdae147ae147ae1;
    local_10[4] = 0x4041333333333333;
    local_10[5] = 0x400a666666666666;
    local_10[6] = 0x405cf51eb851eb85;
    local_10[7] = 0x3feccccccccccccd;
    local_10[8] = 0x4087080000000000;
    local_20 = (long *)N_VNew_Serial(6,local_98);
    iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
    if (iVar1 == 0) {
      local_28 = N_VClone(local_20);
      iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
      if (iVar1 == 0) {
        **(undefined8 **)(*local_20 + 0x10) = 0x3fdc6a7ef9db22d1;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 8) = 0x3f5426fe718a86d7;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x10) = 0;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x18) = 0x3f7cac083126e979;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x20) = 0;
        *(double *)(*(long *)(*local_20 + 0x10) + 0x28) = (double)local_10[6] * 0.444 * 0.007;
        N_VConst(0,local_28);
        local_30 = N_VClone(local_20);
        res((sunrealtype)LS,(N_Vector)LSB,(N_Vector)ctx,(N_Vector)y01,(void *)y02);
        N_VScale(0xbff0000000000000,local_30,local_28);
        N_VDestroy(local_30);
        local_38 = (long *)N_VNew_Serial(1,local_98);
        iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
        if (iVar1 == 0) {
          **(undefined8 **)(*local_38 + 0x10) = 0;
          local_18 = IDACreate(local_98);
          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
          if (iVar1 == 0) {
            local_50 = IDAInit(0,local_18,res,local_20,local_28);
            iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
            if (iVar1 == 0) {
              local_50 = IDASStolerances(0x3e45798ee2308c3a,0x3ddb7cdfd9d7bdbb,local_18);
              iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
              if (iVar1 == 0) {
                local_50 = IDASetUserData(local_18,local_10);
                iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                if (iVar1 == 0) {
                  local_78 = SUNDenseMatrix(6,6,local_98);
                  iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                  if (iVar1 == 0) {
                    local_88 = SUNLinSol_Dense(local_20,local_78,local_98);
                    iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                    if (iVar1 == 0) {
                      local_50 = IDASetLinearSolver(local_18,local_88,local_78);
                      iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                      if (iVar1 == 0) {
                        local_50 = IDAQuadInit(local_18,rhsQ,local_38);
                        iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                        if (iVar1 == 0) {
                          local_50 = IDAQuadSStolerances(0x3ddb7cdfd9d7bdbb,0x3d719799812dea11,
                                                         local_18);
                          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                          if (iVar1 == 0) {
                            local_50 = IDASetQuadErrCon(local_18,1);
                            iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                            if (iVar1 == 0) {
                              local_50 = IDAAdjInit(local_18,0x96,1);
                              iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c);
                              if (iVar1 == 0) {
                                printf("Forward integration ... ");
                                local_50 = IDASolveF(0x4066800000000000,local_18,local_58,local_20,
                                                     local_28,1,local_4c);
                                iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff3c)
                                ;
                                if (iVar1 == 0) {
                                  local_50 = IDAGetNumSteps(local_18,&local_60);
                                  iVar1 = check_retval(returnvalue,funcname,
                                                       in_stack_ffffffffffffff3c);
                                  if (iVar1 == 0) {
                                    printf("done ( nst = %ld )\n",local_60);
                                    local_50 = IDAGetQuad(local_18,local_58,local_38);
                                    iVar1 = check_retval(returnvalue,funcname,
                                                         in_stack_ffffffffffffff3c);
                                    if (iVar1 == 0) {
                                      printf("G:          %24.16f \n",
                                             **(undefined8 **)(*local_38 + 0x10));
                                      printf(
                                            "--------------------------------------------------------\n\n"
                                            );
                                      local_40 = N_VClone(local_20);
                                      iVar1 = check_retval(returnvalue,funcname,
                                                           in_stack_ffffffffffffff3c);
                                      if (iVar1 == 0) {
                                        N_VConst(0,local_40);
                                        local_48 = (long *)N_VClone(local_40);
                                        iVar1 = check_retval(returnvalue,funcname,
                                                             in_stack_ffffffffffffff3c);
                                        if (iVar1 == 0) {
                                          N_VConst(0,local_48);
                                          **(undefined8 **)(*local_48 + 0x10) = 0xbff0000000000000;
                                          local_50 = IDACreateB(local_18,&local_6c);
                                          iVar1 = check_retval(returnvalue,funcname,
                                                               in_stack_ffffffffffffff3c);
                                          if (iVar1 == 0) {
                                            local_50 = IDAInitB(0x4066800000000000,local_18,local_6c
                                                                ,resB,local_40,local_48);
                                            iVar1 = check_retval(returnvalue,funcname,
                                                                 in_stack_ffffffffffffff3c);
                                            if (iVar1 == 0) {
                                              local_50 = IDASStolerancesB(0x3eb0c6f7a0b5ed8d,
                                                                          0x3e45798ee2308c3a,
                                                                          local_18,local_6c);
                                              iVar1 = check_retval(returnvalue,funcname,
                                                                   in_stack_ffffffffffffff3c);
                                              if (iVar1 == 0) {
                                                local_50 = IDASetUserDataB(local_18,local_6c,
                                                                           local_10);
                                                iVar1 = check_retval(returnvalue,funcname,
                                                                     in_stack_ffffffffffffff3c);
                                                if (iVar1 == 0) {
                                                  local_50 = IDASetMaxNumStepsB(local_18,local_6c,
                                                                                1000);
                                                  local_80 = SUNDenseMatrix(6,6,local_98);
                                                  iVar1 = check_retval(returnvalue,funcname,
                                                                       in_stack_ffffffffffffff3c);
                                                  if (iVar1 == 0) {
                                                    local_90 = SUNLinSol_Dense(local_40,local_80,
                                                                               local_98);
                                                    iVar1 = check_retval(returnvalue,funcname,
                                                                         in_stack_ffffffffffffff3c);
                                                    if (iVar1 == 0) {
                                                      local_50 = IDASetLinearSolverB(local_18,
                                                  local_6c,local_90,local_80);
                                                  iVar1 = check_retval(returnvalue,funcname,
                                                                       in_stack_ffffffffffffff3c);
                                                  if (iVar1 == 0) {
                                                    printf("Backward integration ... ");
                                                    local_50 = IDASolveB(0,local_18,1);
                                                    iVar1 = check_retval(returnvalue,funcname,
                                                                         in_stack_ffffffffffffff3c);
                                                    if (iVar1 == 0) {
                                                      uVar2 = IDAGetAdjIDABmem(local_18,local_6c);
                                                      IDAGetNumSteps(uVar2,&local_68);
                                                      printf("done ( nst = %ld )\n",local_68);
                                                      local_50 = IDAGetB(local_18,local_6c,local_58,
                                                                         local_40,local_48);
                                                      iVar1 = check_retval(returnvalue,funcname,
                                                                           in_stack_ffffffffffffff3c
                                                                          );
                                                      if (iVar1 == 0) {
                                                        PrintOutput((sunrealtype)funcname,
                                                                    (N_Vector)
                                                                    CONCAT44(
                                                  in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),(N_Vector)0x102f93);
                                                  IDAFree(&local_18);
                                                  SUNLinSolFree(local_88);
                                                  SUNMatDestroy(local_78);
                                                  SUNLinSolFree(local_90);
                                                  SUNMatDestroy(local_80);
                                                  N_VDestroy(local_20);
                                                  N_VDestroy(local_28);
                                                  N_VDestroy(local_40);
                                                  N_VDestroy(local_48);
                                                  N_VDestroy(local_38);
                                                  free(local_10);
                                                  SUNContext_Free(&local_98);
                                                  local_4 = 0;
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                }
                                                else {
                                                  local_4 = 1;
                                                }
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  UserData data;
  void* mem;
  N_Vector yy, yp, rr, q;
  N_Vector yB, ypB;
  int ncheck, retval;
  sunrealtype time;
  long int nst, nstB;
  int indexB;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;
  SUNContext ctx;

  /* Consistent IC for  y, y'. */
  const sunrealtype y01 = SUN_RCONST(0.444);
  const sunrealtype y02 = SUN_RCONST(0.00123);
  const sunrealtype y03 = SUN_RCONST(0.0);
  const sunrealtype y04 = SUN_RCONST(0.007);
  const sunrealtype y05 = SUN_RCONST(0.0);

  mem = NULL;
  yy = yp = NULL;
  A = AB = NULL;
  LS = LSB = NULL;

  printf("\nAdjoint Sensitivity Example for Akzo-Nobel Chemical Kinetics\n");
  printf("-------------------------------------------------------------\n");
  printf("Sensitivity of G = int_t0^tf (y1) dt with respect to IC.\n");
  printf("-------------------------------------------------------------\n\n");

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate user data. */
  data = (UserData)malloc(sizeof(*data));

  /* Fill user's data with the appropriate values for coefficients. */
  data->k1   = SUN_RCONST(18.7);
  data->k2   = SUN_RCONST(0.58);
  data->k3   = SUN_RCONST(0.09);
  data->k4   = SUN_RCONST(0.42);
  data->K    = SUN_RCONST(34.4);
  data->klA  = SUN_RCONST(3.3);
  data->Ks   = SUN_RCONST(115.83);
  data->pCO2 = SUN_RCONST(0.9);
  data->H    = SUN_RCONST(737.0);

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* Set IC */
  Ith(yy, 1) = y01;
  Ith(yy, 2) = y02;
  Ith(yy, 3) = y03;
  Ith(yy, 4) = y04;
  Ith(yy, 5) = y05;
  Ith(yy, 6) = data->Ks * y01 * y04;

  /* Get y' = - res(t0, y, 0) */
  N_VConst(ZERO, yp);

  rr = N_VClone(yy);
  res(T0, yy, yp, rr, data);
  N_VScale(-ONE, rr, yp);
  N_VDestroy(rr);

  /* Create and initialize q0 for quadratures. */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set tolerances. */
  retval = IDASStolerances(mem, RTOL, ATOL);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Attach user data. */
  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Initialize QUADRATURE(S). */
  retval = IDAQuadInit(mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  /* Set tolerances and error control for quadratures. */
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  /* Prepare ADJOINT. */
  retval = IDAAdjInit(mem, STEPS, IDA_HERMITE);
  if (check_retval(&retval, "IDAAdjInit", 1)) { return (1); }

  /* FORWARD run. */
  printf("Forward integration ... ");
  retval = IDASolveF(mem, TF, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  retval = IDAGetNumSteps(mem, &nst);
  if (check_retval(&retval, "IDAGetNumSteps", 1)) { return (1); }

  printf("done ( nst = %ld )\n", nst);

  retval = IDAGetQuad(mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %24.16Lf \n", Ith(q, 1));
#else
  printf("G:          %24.16f \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n\n");

  /* BACKWARD run */

  /* Initialize yB */
  yB = N_VClone(yy);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB);

  ypB = N_VClone(yB);
  if (check_retval((void*)ypB, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, ypB);
  Ith(ypB, 1) = -ONE;

  retval = IDACreateB(mem, &indexB);
  if (check_retval(&retval, "IDACreateB", 1)) { return (1); }

  retval = IDAInitB(mem, indexB, resB, TF, yB, ypB);
  if (check_retval(&retval, "IDAInitB", 1)) { return (1); }

  retval = IDASStolerancesB(mem, indexB, RTOLB, ATOLB);
  if (check_retval(&retval, "IDASStolerancesB", 1)) { return (1); }

  retval = IDASetUserDataB(mem, indexB, data);
  if (check_retval(&retval, "IDASetUserDataB", 1)) { return (1); }

  retval = IDASetMaxNumStepsB(mem, indexB, 1000);

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, ctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(mem, indexB, LSB, AB);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  printf("Backward integration ... ");

  retval = IDASolveB(mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  IDAGetNumSteps(IDAGetAdjIDABmem(mem, indexB), &nstB);
  printf("done ( nst = %ld )\n", nstB);

  retval = IDAGetB(mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  PrintOutput(time, yB, ypB);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(yB);
  N_VDestroy(ypB);
  N_VDestroy(q);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}